

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O3

Uint32 anon_unknown.dwarf_1c1be9::RenderTargetImpl::equationToGlConstant(Equation blendEquation)

{
  Uint32 UVar1;
  ostream *poVar2;
  int *piVar3;
  
  switch(blendEquation) {
  case Add:
    return 0x8006;
  case Subtract:
    piVar3 = &SF_GLAD_GL_EXT_blend_subtract;
    UVar1 = 0x800a;
    break;
  case ReverseSubtract:
    piVar3 = &SF_GLAD_GL_EXT_blend_subtract;
    UVar1 = 0x800b;
    break;
  case Min:
    piVar3 = &SF_GLAD_GL_EXT_blend_minmax;
    UVar1 = 0x8007;
    break;
  case Max:
    piVar3 = &SF_GLAD_GL_EXT_blend_minmax;
    UVar1 = 0x8008;
    break;
  default:
    goto switchD_0016b5a2_default;
  }
  if (*piVar3 != 0) {
    return UVar1;
  }
switchD_0016b5a2_default:
  if (sf::RenderTarget::applyBlendMode(sf::BlendMode_const&)::warned._1_1_ != '\0') {
    return 0x8006;
  }
  poVar2 = sf::err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable",0x43);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = sf::err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Some blending equations will fallback to sf::BlendMode::Add",0x3b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  poVar2 = sf::err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"Ensure that hardware acceleration is enabled if available",0x39);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  sf::RenderTarget::applyBlendMode(sf::BlendMode_const&)::warned._1_1_ = 1;
  return 0x8006;
}

Assistant:

sf::Uint32 equationToGlConstant(sf::BlendMode::Equation blendEquation)
        {
            switch (blendEquation)
            {
                case sf::BlendMode::Add:
                    return GLEXT_GL_FUNC_ADD;
                case sf::BlendMode::Subtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_SUBTRACT;
                    break;
                case sf::BlendMode::ReverseSubtract:
                    if (GLEXT_blend_subtract)
                        return GLEXT_GL_FUNC_REVERSE_SUBTRACT;
                    break;
                case sf::BlendMode::Min:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MIN;
                    break;
                case sf::BlendMode::Max:
                    if (GLEXT_blend_minmax)
                        return GLEXT_GL_MAX;
                    break;
            }

            static bool warned = false;
            if (!warned)
            {
                sf::err() << "OpenGL extension EXT_blend_minmax or EXT_blend_subtract unavailable" << std::endl;
                sf::err() << "Some blending equations will fallback to sf::BlendMode::Add" << std::endl;
                sf::err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

                warned = true;
            }

            return GLEXT_GL_FUNC_ADD;
        }